

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O0

void __thiscall DCFGReader::buildCFG(DCFGReader *this,int entry)

{
  CFG *pCVar1;
  bool bVar2;
  Type TVar3;
  mapped_type *pmVar4;
  CFG *this_00;
  CfgNode *pCVar5;
  CfgNode *pCVar6;
  unsigned_long_long count_00;
  reference pvVar7;
  BlockData *this_01;
  mapped_type *this_02;
  pointer ppVar8;
  CFG *pCVar9;
  Addr local_1e0;
  _Self local_138;
  _Self local_130;
  CFG *local_128;
  CFG *sigHandler;
  _Self local_118;
  CFG *local_110;
  CFG *called;
  unsigned_long_long count;
  _Rb_tree_const_iterator<std::pair<const_int,_DCFGReader::Node>_> local_f8;
  Addr local_f0;
  Addr dst_addr;
  _Rb_tree_const_iterator<std::pair<const_int,_DCFGReader::Node>_> local_e0;
  const_iterator it;
  Edge *edge;
  iterator __end2;
  iterator __begin2;
  mapped_type *__range2;
  CfgNode *src_node;
  Node *src_bb;
  _Self local_98;
  _Self local_90;
  int local_84;
  undefined1 local_80 [4];
  int src_id;
  list<int,_std::allocator<int>_> worklist;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  CfgNode *entry_node;
  CFG *cfg;
  DCFGReader *pDStack_10;
  int entry_local;
  DCFGReader *this_local;
  
  cfg._4_4_ = entry;
  pDStack_10 = this;
  pmVar4 = std::
           map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
           ::operator[](&this->m_nodes,(key_type_conflict *)((long)&cfg + 4));
  this_00 = CFGReader::instance(&this->super_CFGReader,pmVar4->addr);
  pCVar5 = CFG::entryNode(this_00);
  if (pCVar5 != (CfgNode *)0x0) {
    __assert_fail("cfg->entryNode() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                  ,0x44,"void DCFGReader::buildCFG(int)");
  }
  pCVar5 = (CfgNode *)operator_new(0x18);
  CfgNode::CfgNode(pCVar5,CFG_ENTRY);
  CFG::addNode(this_00,pCVar5);
  pmVar4 = std::
           map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
           ::operator[](&this->m_nodes,(key_type_conflict *)((long)&cfg + 4));
  pCVar6 = CFG::nodeByAddr(this_00,pmVar4->addr);
  if (pCVar6 == (CfgNode *)0x0) {
    pmVar4 = std::
             map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
             ::operator[](&this->m_nodes,(key_type_conflict *)((long)&cfg + 4));
    pCVar6 = CFGReader::nodeWithAddr(this_00,pmVar4->addr);
    count_00 = CFG::execs(this_00);
    CFG::addEdge(this_00,pCVar5,pCVar6,count_00);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               &worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
    std::__cxx11::list<int,_std::allocator<int>_>::list((list<int,_std::allocator<int>_> *)local_80)
    ;
    std::__cxx11::list<int,_std::allocator<int>_>::push_back
              ((list<int,_std::allocator<int>_> *)local_80,(key_type_conflict *)((long)&cfg + 4));
    while( true ) {
      bVar2 = std::__cxx11::list<int,_std::allocator<int>_>::empty
                        ((list<int,_std::allocator<int>_> *)local_80);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        std::__cxx11::list<int,_std::allocator<int>_>::~list
                  ((list<int,_std::allocator<int>_> *)local_80);
        std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   &worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size);
        return;
      }
      pvVar7 = std::__cxx11::list<int,_std::allocator<int>_>::front
                         ((list<int,_std::allocator<int>_> *)local_80);
      local_84 = *pvVar7;
      std::__cxx11::list<int,_std::allocator<int>_>::pop_front
                ((list<int,_std::allocator<int>_> *)local_80);
      if (local_84 < 4) break;
      local_90._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      &worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size,
                      &local_84);
      local_98._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::cend
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)
                      &worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size)
      ;
      bVar2 = std::operator!=(&local_90,&local_98);
      if (!bVar2) {
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   &worklist.super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size,
                   &local_84);
        pmVar4 = std::
                 map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
                 ::operator[](&this->m_nodes,&local_84);
        pCVar5 = CFG::nodeByAddr(this_00,pmVar4->addr);
        bVar2 = false;
        if (pCVar5 != (CfgNode *)0x0) {
          TVar3 = CfgNode::type(pCVar5);
          bVar2 = TVar3 == CFG_PHANTOM;
        }
        if (!bVar2) {
          __assert_fail("src_node != 0 && src_node->type() == CfgNode::CFG_PHANTOM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                        ,0x5c,"void DCFGReader::buildCFG(int)");
        }
        this_01 = (BlockData *)operator_new(0x90);
        CfgNode::BlockData::BlockData(this_01,pmVar4->addr,pmVar4->size,false);
        CfgNode::setData(pCVar5,(Data *)this_01);
        this_02 = std::
                  map<int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>_>_>_>
                  ::operator[](&this->m_edges,&local_84);
        __end2 = std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>::begin
                           (this_02);
        edge = (Edge *)std::__cxx11::list<DCFGReader::Edge,_std::allocator<DCFGReader::Edge>_>::end
                                 (this_02);
        while (bVar2 = std::operator!=(&__end2,(_Self *)&edge), bVar2) {
          it._M_node = (_Base_ptr)std::_List_iterator<DCFGReader::Edge>::operator*(&__end2);
          if ((it._M_node)->_M_color != 3) {
            dst_addr = (Addr)std::
                             map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
                             ::find(&this->m_nodes,(key_type_conflict *)it._M_node);
            std::_Rb_tree_const_iterator<std::pair<const_int,_DCFGReader::Node>_>::
            _Rb_tree_const_iterator(&local_e0,(iterator *)&dst_addr);
            count = (unsigned_long_long)
                    std::
                    map<int,_DCFGReader::Node,_std::less<int>,_std::allocator<std::pair<const_int,_DCFGReader::Node>_>_>
                    ::end(&this->m_nodes);
            std::_Rb_tree_const_iterator<std::pair<const_int,_DCFGReader::Node>_>::
            _Rb_tree_const_iterator(&local_f8,(iterator *)&count);
            bVar2 = std::operator!=(&local_e0,&local_f8);
            if (bVar2) {
              ppVar8 = std::_Rb_tree_const_iterator<std::pair<const_int,_DCFGReader::Node>_>::
                       operator->(&local_e0);
              local_1e0 = (ppVar8->second).addr;
            }
            else {
              local_1e0 = 0;
            }
            local_f0 = local_1e0;
            called = (CFG *)(it._M_node)->_M_parent;
            switch(*(undefined4 *)&(it._M_node)->field_0x4) {
            case 2:
              if ((it._M_node)->_M_color != 2) {
                __assert_fail("edge.dst_id == 2",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                              ,0x86,"void DCFGReader::buildCFG(int)");
              }
              pCVar6 = CFGReader::haltNode(this_00);
              CFG::addEdge(this_00,pCVar5,pCVar6,(unsigned_long_long)called);
              break;
            default:
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                            ,0x95,"void DCFGReader::buildCFG(int)");
            case 5:
              CFGReader::markIndirect(pCVar5);
            case 4:
            case 0x13:
              pCVar9 = CFGReader::instance(&this->super_CFGReader,local_f0);
              pCVar1 = called;
              local_110 = pCVar9;
              local_118._M_node =
                   (_Base_ptr)
                   std::set<int,_std::less<int>,_std::allocator<int>_>::find
                             (&this->m_visited,&local_84);
              sigHandler = (CFG *)std::set<int,_std::less<int>,_std::allocator<int>_>::cend
                                            (&this->m_visited);
              bVar2 = std::operator==(&local_118,(_Self *)&sigHandler);
              CFGReader::addCall(pCVar5,pCVar9,(unsigned_long_long)pCVar1,bVar2);
              break;
            case 6:
              pCVar6 = CFGReader::exitNode(this_00);
              CFG::addEdge(this_00,pCVar5,pCVar6,(unsigned_long_long)called);
              break;
            case 0xd:
              pCVar6 = CFGReader::nodeWithAddr(this_00,local_1e0);
              CFG::addEdge(this_00,pCVar5,pCVar6,(unsigned_long_long)called);
              pCVar6 = CFGReader::nodeWithAddr(this_00,pmVar4->addr + (long)pmVar4->size);
              CFG::addEdge(this_00,pCVar5,pCVar6,0);
              std::__cxx11::list<int,_std::allocator<int>_>::push_back
                        ((list<int,_std::allocator<int>_> *)local_80,
                         (value_type_conflict1 *)it._M_node);
              break;
            case 0x10:
              CFGReader::markIndirect(pCVar5);
            case 7:
            case 0xf:
            case 0x11:
            case 0x12:
            case 0x15:
            case 0x19:
              pCVar6 = CFGReader::nodeWithAddr(this_00,local_f0);
              CFG::addEdge(this_00,pCVar5,pCVar6,(unsigned_long_long)called);
              std::__cxx11::list<int,_std::allocator<int>_>::push_back
                        ((list<int,_std::allocator<int>_> *)local_80,
                         (value_type_conflict1 *)it._M_node);
              break;
            case 0x16:
              pCVar9 = CFGReader::instance(&this->super_CFGReader,local_1e0);
              pCVar1 = called;
              local_128 = pCVar9;
              local_130._M_node =
                   (_Base_ptr)
                   std::set<int,_std::less<int>,_std::allocator<int>_>::find
                             (&this->m_visited,&local_84);
              local_138._M_node =
                   (_Base_ptr)
                   std::set<int,_std::less<int>,_std::allocator<int>_>::cend(&this->m_visited);
              bVar2 = std::operator==(&local_130,&local_138);
              CFGReader::addSignalHandler(pCVar5,0,pCVar9,(unsigned_long_long)pCVar1,bVar2);
            }
          }
          std::_List_iterator<DCFGReader::Edge>::operator++(&__end2);
        }
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert(&this->m_visited,&local_84);
      }
    }
    __assert_fail("src_id > 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                  ,0x54,"void DCFGReader::buildCFG(int)");
  }
  __assert_fail("cfg->nodeByAddr(m_nodes[entry].addr) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                ,0x49,"void DCFGReader::buildCFG(int)");
}

Assistant:

void DCFGReader::buildCFG(int entry) {
	CFG* cfg = this->instance(m_nodes[entry].addr);

	// Add special entry node.
	assert(cfg->entryNode() == 0);
	CfgNode* entry_node = new CfgNode(CfgNode::CFG_ENTRY);
	cfg->addNode(entry_node);

	// Add the first node.
	assert(cfg->nodeByAddr(m_nodes[entry].addr) == 0);
	cfg->addEdge(entry_node, CFGReader::nodeWithAddr(cfg, m_nodes[entry].addr),
					cfg->execs());

	std::set<int> visited;
	std::list<int> worklist;
	worklist.push_back(entry);

	while (!worklist.empty()) {
		int src_id = worklist.front();
		worklist.pop_front();
		assert(src_id > 3);

		if (visited.find(src_id) != visited.cend())
			continue;
		visited.insert(src_id);

		DCFGReader::Node& src_bb = m_nodes[src_id];
		CfgNode* src_node = cfg->nodeByAddr(src_bb.addr);
		assert(src_node != 0 && src_node->type() == CfgNode::CFG_PHANTOM);
		src_node->setData(new CfgNode::BlockData(src_bb.addr, src_bb.size));

		for (DCFGReader::Edge& edge : m_edges[src_id]) {
			// Ignore unknown node.
			if (edge.dst_id == UNKNOWN_NODE)
				continue;

			std::map<int, Node>::const_iterator it = m_nodes.find(edge.dst_id);
			Addr dst_addr = (it != m_nodes.end() ? (it->second).addr : 0);

			unsigned long long count = edge.count;

			switch (edge.edge_type) {
				case INDIRECT_UNCONDITIONAL_BRANCH_EDGE:
					CFGReader::markIndirect(src_node);
					// fallthrough.
				case REP_EDGE:
				case CALL_BYPASS_EDGE:
				case SYSTEM_CALL_BYPASS_EDGE:
				case DIRECT_UNCONDITIONAL_BRANCH_EDGE:
				case FALL_THROUGH_EDGE:
				case EXCLUDED_CODE_BYPASS_EDGE:
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, dst_addr), count);
					worklist.push_back(edge.dst_id);
					break;
				case DIRECT_CONDITIONAL_BRANCH_EDGE:
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, dst_addr), count);
					cfg->addEdge(src_node, CFGReader::nodeWithAddr(cfg, src_bb.addr + src_bb.size));
					worklist.push_back(edge.dst_id);
					break;
				case INDIRECT_CALL_EDGE:
					CFGReader::markIndirect(src_node);
					// fallthrough
				case SYSTEM_CALL_EDGE:
				case DIRECT_CALL_EDGE: {
					CFG* called = this->instance(dst_addr);
					CFGReader::addCall(src_node, called, count,
						m_visited.find(src_id) == m_visited.cend());
					} break;
				case EXIT_EDGE:
					// The destination must be the special exit node (2).
					assert(edge.dst_id == 2);
					cfg->addEdge(src_node, CFGReader::haltNode(cfg), count);
					break;
				case RETURN_EDGE:
					cfg->addEdge(src_node, CFGReader::exitNode(cfg), count);
					break;
				case CONTEXT_CHANGE_EDGE: {
					CFG* sigHandler = this->instance(dst_addr);
					CFGReader::addSignalHandler(src_node, 0, sigHandler, count,
						m_visited.find(src_id) == m_visited.cend());

					} break;
				default: {
					// std::vector<std::string> edgeTypes = readStrings(obj, "EDGE_TYPES");
					// std::cout << "edge type: " << edgeTypes[edge.edge_type] << "\n";
					assert(false);
					} break;
			}
		}

		// Added to the global visited ids.
		m_visited.insert(src_id);
	}
}